

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

uint32_t helper_pmovmskb_xmm_x86_64(CPUX86State *env,ZMMReg *s)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [15];
  undefined1 auVar4 [14];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [14];
  undefined1 auVar8 [15];
  undefined1 auVar9 [14];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  unkuint9 Var13;
  undefined1 auVar14 [11];
  undefined1 auVar15 [13];
  undefined1 auVar16 [14];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [16];
  undefined1 auVar20 [14];
  undefined2 uVar22;
  undefined1 auVar21 [16];
  
  uVar1 = s->_q_ZMMReg[1];
  auVar3._8_6_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xe] = (char)(uVar1 >> 0x38);
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[0xc] = (char)(uVar1 >> 0x30);
  auVar5._13_2_ = auVar3._13_2_;
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._12_3_ = auVar5._12_3_;
  auVar8._8_2_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8[10] = (char)(uVar1 >> 0x28);
  auVar8._11_4_ = auVar6._11_4_;
  auVar10._8_2_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10._10_5_ = auVar8._10_5_;
  auVar11[8] = (char)(uVar1 >> 0x20);
  auVar11._0_8_ = uVar1;
  auVar11._9_6_ = auVar10._9_6_;
  auVar12._7_8_ = 0;
  auVar12._0_7_ = auVar11._8_7_;
  Var13 = CONCAT81(SUB158(auVar12 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar17._9_6_ = 0;
  auVar17._0_9_ = Var13;
  auVar14._1_10_ = SUB1510(auVar17 << 0x30,5);
  auVar14[0] = (char)(uVar1 >> 0x10);
  auVar18._11_4_ = 0;
  auVar18._0_11_ = auVar14;
  auVar15._1_12_ = SUB1512(auVar18 << 0x20,3);
  auVar15[0] = (char)(uVar1 >> 8);
  auVar19._0_2_ = (ushort)(byte)uVar1 * 2;
  auVar19._2_2_ = auVar15._0_2_ * 4;
  auVar19._4_2_ = auVar14._0_2_ * 8;
  auVar19._6_2_ = (short)Var13 * 0x10;
  auVar19._8_2_ = auVar11._8_2_ * 0x20;
  auVar19._10_2_ = auVar8._10_2_ * 0x40;
  auVar19._12_2_ = auVar5._12_2_ * 0x80;
  auVar19._14_2_ = auVar3._13_2_ & 0xff00;
  auVar19 = auVar19 & _DAT_00b6ea40;
  auVar21._0_8_ = auVar19._8_8_;
  auVar21._8_4_ = auVar19._8_4_;
  auVar21._12_4_ = auVar19._12_4_;
  auVar20 = auVar21._0_14_ | auVar19._0_14_;
  uVar22 = auVar20._6_2_;
  auVar2._10_2_ = 0;
  auVar2._0_10_ = auVar20._0_10_;
  auVar2._12_2_ = uVar22;
  auVar4._8_2_ = auVar20._4_2_;
  auVar4._0_8_ = auVar20._0_8_;
  auVar4._10_4_ = auVar2._10_4_;
  auVar16._6_8_ = 0;
  auVar16._0_6_ = auVar4._8_6_;
  auVar7._4_2_ = auVar20._2_2_;
  auVar7._0_4_ = auVar20._0_4_;
  auVar7._6_8_ = SUB148(auVar16 << 0x40,6);
  auVar9._4_10_ = auVar7._4_10_;
  auVar9._0_4_ = auVar20._0_4_ & 0xffff;
  auVar20._4_2_ = uVar22;
  auVar20._0_4_ = auVar4._8_4_;
  auVar20._6_2_ = 0;
  auVar20._8_4_ = auVar4._8_4_;
  auVar20._12_2_ = uVar22;
  return SUB144(auVar20 | auVar9,4) | SUB144(auVar20 | auVar9,0) |
         s->_b_ZMMReg[7] & 0xffffff80 | s->_b_ZMMReg[6] >> 1 & 0x40 |
         s->_b_ZMMReg[5] >> 2 & 0x20 |
         s->_l_ZMMReg[1] >> 3 & 0x10 |
         s->_b_ZMMReg[3] >> 4 & 8 |
         s->_b_ZMMReg[2] >> 5 & 4 | s->_b_ZMMReg[1] >> 6 & 2 | (uint)(s->_b_ZMMReg[0] >> 7);
}

Assistant:

uint32_t glue(helper_pmovmskb, SUFFIX)(CPUX86State *env, Reg *s)
{
    uint32_t val;

    val = 0;
    val |= (s->B(0) >> 7);
    val |= (s->B(1) >> 6) & 0x02;
    val |= (s->B(2) >> 5) & 0x04;
    val |= (s->B(3) >> 4) & 0x08;
    val |= (s->B(4) >> 3) & 0x10;
    val |= (s->B(5) >> 2) & 0x20;
    val |= (s->B(6) >> 1) & 0x40;
    val |= (s->B(7)) & 0x80;
#if SHIFT == 1
    val |= (s->B(8) << 1) & 0x0100;
    val |= (s->B(9) << 2) & 0x0200;
    val |= (s->B(10) << 3) & 0x0400;
    val |= (s->B(11) << 4) & 0x0800;
    val |= (s->B(12) << 5) & 0x1000;
    val |= (s->B(13) << 6) & 0x2000;
    val |= (s->B(14) << 7) & 0x4000;
    val |= (s->B(15) << 8) & 0x8000;
#endif
    return val;
}